

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O3

FPError * __thiscall
phyr::FPError::operator*(FPError *__return_storage_ptr__,FPError *this,FPError *fp)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  dVar3 = fp->lBound * this->lBound;
  dVar4 = fp->lBound * this->uBound;
  auVar5._0_8_ = fp->uBound * this->lBound;
  auVar5._8_8_ = fp->uBound * this->uBound;
  auVar6._8_8_ = auVar5._8_8_;
  auVar6._0_8_ = auVar5._0_8_;
  auVar7._8_8_ = dVar4;
  auVar7._0_8_ = dVar3;
  auVar7 = minpd(auVar6,auVar7);
  dVar2 = auVar7._8_8_;
  if (auVar7._0_8_ <= auVar7._8_8_) {
    dVar2 = auVar7._0_8_;
  }
  if (-INFINITY < dVar2) {
    dVar2 = (double)(~-(ulong)(dVar2 == 0.0) & (ulong)dVar2 |
                    -(ulong)(dVar2 == 0.0) & 0x8000000000000000);
    dVar2 = (double)((long)dVar2 + (ulong)(dVar2 <= 0.0) * 2 + -1);
  }
  else {
    dVar2 = -INFINITY;
  }
  auVar1._8_8_ = dVar4;
  auVar1._0_8_ = dVar3;
  auVar7 = maxpd(auVar5,auVar1);
  dVar3 = auVar7._8_8_;
  if (auVar7._8_8_ <= auVar7._0_8_) {
    dVar3 = auVar7._0_8_;
  }
  if (dVar3 < INFINITY) {
    dVar3 = (double)(~-(ulong)(dVar3 == 0.0) & (ulong)dVar3);
    dVar3 = (double)((-(ulong)(dVar3 < 0.0) | 1) + (long)dVar3);
  }
  else {
    dVar3 = INFINITY;
  }
  __return_storage_ptr__->v = this->v * fp->v;
  __return_storage_ptr__->lBound = dVar2;
  __return_storage_ptr__->uBound = dVar3;
  return __return_storage_ptr__;
}

Assistant:

FPError operator*(const FPError& fp) const {
        Real _b[4] = {
            lBound * fp.lBound, lBound * fp.uBound,
            uBound * fp.lBound, uBound * fp.uBound
        };

        return FPError(v * fp.v,
                       nextFloatDown(std::min(std::min(_b[0], _b[1]), std::min(_b[2], _b[3]))),
                       nextFloatUp(std::max(std::max(_b[0], _b[1]), std::max(_b[2], _b[3]))));
    }